

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

ON_Brep * ON_BrepTorus(ON_Torus *torus,ON_Brep *pBrep)

{
  ON_Brep *pOVar1;
  ulong uVar2;
  double dVar3;
  ON_RevSurface *pRevSurface;
  ON_RevSurface *local_20;
  
  if (pBrep != (ON_Brep *)0x0) {
    ON_Brep::Destroy(pBrep);
  }
  pOVar1 = (ON_Brep *)0x0;
  local_20 = ON_Torus::RevSurfaceForm(torus,(ON_RevSurface *)0x0);
  if (local_20 != (ON_RevSurface *)0x0) {
    dVar3 = ABS(torus->major_radius) * 3.141592653589793;
    uVar2 = -(ulong)(1.490116119385e-08 < ABS(torus->major_radius));
    (*(local_20->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
              (0,~uVar2 & 0x401921fb54442d18 | (ulong)(dVar3 + dVar3) & uVar2,local_20,0);
    dVar3 = ABS(torus->minor_radius) * 3.141592653589793;
    uVar2 = -(ulong)(1.490116119385e-08 < ABS(torus->minor_radius));
    (*(local_20->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
              (0,~uVar2 & 0x401921fb54442d18 | (ulong)(dVar3 + dVar3) & uVar2);
    pOVar1 = ON_BrepRevSurface(&local_20,false,false,pBrep);
    if (pOVar1 == (ON_Brep *)0x0) {
      if (local_20 != (ON_RevSurface *)0x0) {
        (*(local_20->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
      }
      pOVar1 = (ON_Brep *)0x0;
    }
  }
  return pOVar1;
}

Assistant:

ON_Brep* ON_BrepTorus( const ON_Torus& torus, ON_Brep* pBrep )
{
  bool bArcLengthParameterization = true;
  ON_Brep* brep = nullptr;
  if ( pBrep )
    pBrep->Destroy();
  ON_RevSurface* pRevSurface = torus.RevSurfaceForm();
  if ( pRevSurface )
  {
    if ( bArcLengthParameterization )
    {
      double r = fabs(torus.major_radius);
      if ( r <= ON_SQRT_EPSILON )
        r = 1.0;
      r *= ON_PI;
      pRevSurface->SetDomain(0,0.0,2.0*r);
      r = fabs(torus.minor_radius);
      if ( r <= ON_SQRT_EPSILON )
        r = 1.0;
      r *= ON_PI;
      pRevSurface->SetDomain(1,0.0,2.0*r);
    }
    brep = ON_BrepRevSurface( pRevSurface, false, false, pBrep );
    if ( !brep )
      delete pRevSurface;
  }
  return brep;
}